

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O2

string * namingConventions::editToNewName
                   (string *__return_storage_ptr__,string *word,string *oldName,string *correctName)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint c;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  _Alloc_hider local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  string *local_40;
  string *local_38;
  
  local_60._M_p = &local_50;
  local_58 = 0;
  local_50 = '\0';
  uVar6 = 0;
  uVar9 = 0;
  uVar8 = 0;
  iVar3 = 0;
  uVar10 = 0;
  bVar2 = false;
  uVar7 = 0;
  for (uVar4 = 0; (ulong)uVar4 < word->_M_string_length; uVar4 = uVar4 + 1) {
    bVar1 = (word->_M_dataplus)._M_p[uVar4];
    if (bVar1 == 0x28) {
      uVar10 = (ulong)uVar4;
    }
    if ((bVar1 != (oldName->_M_dataplus)._M_p[uVar7]) || (bVar2)) {
      if ((bVar1 & 0xfe) != 0x28) {
        iVar3 = iVar3 + (uint)(bVar1 != 0x3b);
      }
      uVar6 = 0;
      bVar2 = false;
      uVar7 = 0;
    }
    else {
      iVar5 = (int)uVar6;
      if (oldName->_M_string_length - 1 == uVar6) {
        if (iVar5 == 0) {
          uVar9 = (ulong)uVar4;
        }
        bVar2 = true;
        uVar8 = uVar4;
      }
      else {
        uVar7 = (ulong)((int)uVar7 + 1);
        uVar6 = (ulong)(iVar5 + 1);
        if (iVar5 == 0) {
          uVar9 = (ulong)uVar4;
        }
      }
    }
  }
  local_40 = correctName;
  local_38 = __return_storage_ptr__;
  if (iVar3 == 0) {
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      std::__cxx11::string::push_back((char)&local_60);
    }
    std::__cxx11::string::append((string *)&local_60);
    while (uVar8 = uVar8 + 1, __return_storage_ptr__ = local_38,
          (ulong)uVar8 < word->_M_string_length) {
      std::__cxx11::string::push_back((char)&local_60);
    }
  }
  else {
    if ((int)uVar10 == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)word);
      goto LAB_0012704a;
    }
    if (bVar2) {
      for (uVar9 = 0; (int)uVar10 + 1 != uVar9; uVar9 = uVar9 + 1) {
        std::__cxx11::string::push_back((char)&local_60);
      }
      std::__cxx11::string::append((string *)&local_60);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_60);
      for (; uVar10 < word->_M_string_length; uVar10 = (ulong)((int)uVar10 + 1)) {
        std::__cxx11::string::push_back((char)&local_60);
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_60._M_p == &local_50) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_48;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_60._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
  }
  __return_storage_ptr__->_M_string_length = local_58;
  local_58 = 0;
  local_50 = '\0';
  local_60._M_p = &local_50;
LAB_0012704a:
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string
namingConventions::editToNewName(std::string &word, const std::string &oldName, const std::string &correctName) {
    unsigned int correctCount = 0;
    unsigned int start = 0;
    unsigned int end = 0;
    unsigned int misses = 0;
    std::string newName;
    unsigned int functionCall = 0;

    bool found = false;
    unsigned int oldname_i = 0;

    // zoekt start en eindpunt van gezochte naam in stukje tekst, telt het aantal misses, etc..
    for (unsigned int c = 0; c < word.size(); ++c) {
      if(word[c] == '('){
        functionCall = c;
      }

        if (word[c] == oldName[oldname_i] && !found) {
            if (correctCount == oldName.size() - 1) {
                end = c;
                found = true;
                if(correctCount == 0){
                  start = c;
                }
            } else {
                correctCount += 1;
                oldname_i += 1;
                if (correctCount == 1) {
                    start = c;
                }
            }

        } else {
            correctCount = 0;
            found = false;
            oldname_i = 0;
            if(word[c] != '(' && word[c] != ')' && word[c] != ';' )
            misses += 1;
        }
    }

    // past de tekst aan
    if(misses > 0){
      if(functionCall != 0 && found){
        unsigned int pos = 0;
        while (pos != functionCall + 1) { //variable in function call
          newName += word[pos];
          pos += 1;
        }
        newName += correctName;
        return newName;

      }else if(functionCall != 0){  // function being called
        newName = correctName;
        while (functionCall < word.size()) {
          newName += word[functionCall];
          functionCall += 1;
        }
        return newName;
      }
      return word;
    }
    unsigned int pos = 0;
    while (pos != start) {
        newName += word[pos];
        pos += 1;
    }
    newName += correctName;
    pos = end + 1;
    while (pos < word.size()) {
        newName += word[pos];
        pos += 1;
    }
    return newName;

}